

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O2

int __thiscall RandomBotStrategy::intInput(RandomBotStrategy *this,StrategyContext context)

{
  int iVar1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar2;
  uint uVar3;
  result_type_conflict rVar4;
  reference ppCVar5;
  ostream *poVar6;
  long lVar7;
  mt19937 *pmVar8;
  unsigned_long *puVar9;
  byte bVar10;
  unsigned_long auStack_4e48 [625];
  uniform_int_distribution<int> local_3ac0;
  mt19937 gen;
  uniform_int_distribution<int> dis;
  random_device rd;
  
  bVar10 = 0;
  std::random_device::random_device(&rd);
  uVar3 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&gen,(ulong)uVar3);
  rVar4 = 0;
  switch(context) {
  case ATTACK_FROM_COUNTRY:
    memcpy((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)&dis,&gen,5000);
    pvVar2 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
    local_3ac0._M_param._M_b =
         (int)((ulong)((long)(pvVar2->
                             super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar2->
                            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                            _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    local_3ac0._M_param._M_a = 0;
    rVar4 = std::uniform_int_distribution<int>::operator()
                      (&local_3ac0,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)&dis);
    ppCVar5 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                        (((this->super_PlayerStrategy).player)->pOwnedCountries,(long)rVar4);
    goto LAB_0010a280;
  case ATTACK_TO_COUNTRY:
    memcpy((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)&dis,&gen,5000);
    pvVar2 = ((this->super_PlayerStrategy).from)->pAdjCountries;
    local_3ac0._M_param._M_b =
         (int)((ulong)((long)(pvVar2->
                             super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar2->
                            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                            _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    local_3ac0._M_param._M_a = 0;
    rVar4 = std::uniform_int_distribution<int>::operator()
                      (&local_3ac0,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)&dis);
    ppCVar5 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                        (((this->super_PlayerStrategy).from)->pAdjCountries,(long)rVar4);
    goto LAB_0010a342;
  case ATTACK_DICE_COUNT:
    memcpy((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)&dis,&gen,5000);
    iVar1 = *((this->super_PlayerStrategy).from)->pNumberOfTroops;
    local_3ac0._M_param._M_b = 3;
    if (iVar1 < 4) {
      local_3ac0._M_param._M_b = (iVar1 == 3) + 1;
    }
    local_3ac0._M_param._M_a = 1;
    rVar4 = std::uniform_int_distribution<int>::operator()
                      (&local_3ac0,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)&dis);
    break;
  case ATTACK_NEW_ARMY_COUNT:
    memcpy((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)&dis,&gen,5000);
    local_3ac0._M_param._M_b = *((this->super_PlayerStrategy).from)->pNumberOfTroops + -1;
    local_3ac0._M_param._M_a = 0;
    rVar4 = std::uniform_int_distribution<int>::operator()
                      (&local_3ac0,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)&dis);
    break;
  case DEFEND_DICE_COUNT:
    dis._M_param._M_b = (1 < *((this->super_PlayerStrategy).to)->pNumberOfTroops) + 1;
    dis._M_param._M_a = 1;
    rVar4 = std::uniform_int_distribution<int>::operator()(&dis,&gen);
    break;
  case FORTIFY_FROM_COUNTRY:
    memcpy((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)&dis,&gen,5000);
    pvVar2 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
    local_3ac0._M_param._M_b =
         (int)((ulong)((long)(pvVar2->
                             super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar2->
                            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                            _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    local_3ac0._M_param._M_a = 0;
    rVar4 = std::uniform_int_distribution<int>::operator()
                      (&local_3ac0,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)&dis);
    ppCVar5 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                        (((this->super_PlayerStrategy).player)->pOwnedCountries,(long)rVar4);
LAB_0010a280:
    (this->super_PlayerStrategy).from = *ppCVar5;
    break;
  case FORTIFY_TO_COUNTRY:
    memcpy((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)&dis,&gen,5000);
    pvVar2 = ((this->super_PlayerStrategy).from)->pAdjCountries;
    local_3ac0._M_param._M_b =
         (int)((ulong)((long)(pvVar2->
                             super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar2->
                            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                            _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    local_3ac0._M_param._M_a = 0;
    rVar4 = std::uniform_int_distribution<int>::operator()
                      (&local_3ac0,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)&dis);
    ppCVar5 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                        (((this->super_PlayerStrategy).from)->pAdjCountries,(long)rVar4);
LAB_0010a342:
    (this->super_PlayerStrategy).to = *ppCVar5;
    break;
  case FORTIFY_ARMY_COUNT:
    memcpy((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)&dis,&gen,5000);
    local_3ac0._M_param._M_b = *((this->super_PlayerStrategy).from)->pNumberOfTroops + -1;
    local_3ac0._M_param._M_a = 0;
    rVar4 = std::uniform_int_distribution<int>::operator()
                      (&local_3ac0,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)&dis);
    break;
  case REINFORCE_CARD_COUNT:
    iVar1 = *(this->super_PlayerStrategy).exchangingCardType;
    pmVar8 = &gen;
    puVar9 = auStack_4e48;
    for (lVar7 = 0x271; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar9 = pmVar8->_M_x[0];
      pmVar8 = (mt19937 *)((long)pmVar8 + (ulong)bVar10 * -0x10 + 8);
      puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
    }
    rVar4 = reinforceMaxCards(this,iVar1);
    break;
  case REINFORCE_ARMY_COUNT:
    dis._M_param._M_b = *(this->super_PlayerStrategy).armiesToPlace;
    dis._M_param._M_a = 0;
    rVar4 = std::uniform_int_distribution<int>::operator()(&dis,&gen);
  }
  poVar6 = std::operator<<((ostream *)&std::cout," ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,rVar4);
  std::endl<char,std::char_traits<char>>(poVar6);
  std::random_device::~random_device(&rd);
  return rVar4;
}

Assistant:

int RandomBotStrategy::intInput(StrategyContext context) {
    int userInput = 0;
    std::random_device rd; // random number generator
    std::mt19937 gen(rd()); // seed the generator
    switch((int) context) {
        case StrategyContext::ATTACK_FROM_COUNTRY: {
            userInput = RandomBotStrategy::chooseRandomCountry(gen);
            from = player->getOwnedCountries()->at(userInput);
        } break;
        case StrategyContext::ATTACK_TO_COUNTRY: {
            userInput = RandomBotStrategy::chooseRandomNeighbour(gen);
            to = from->getAdjCountries()->at(userInput);
        } break;
        case StrategyContext::ATTACK_DICE_COUNT: {
            userInput = RandomBotStrategy::attackMaxDice(gen);
        } break;
        case StrategyContext::DEFEND_DICE_COUNT: {
            int maxDice = (to->getNumberOfTroops() >= 2) ? 2 : 1;
            std::uniform_int_distribution<> dis(1, maxDice);
            userInput = dis(gen);
        } break;
        case StrategyContext::FORTIFY_FROM_COUNTRY: {
            userInput = RandomBotStrategy::chooseRandomCountry(gen);
            from = player->getOwnedCountries()->at(userInput);
        } break;
        case StrategyContext::FORTIFY_TO_COUNTRY: {
            userInput = RandomBotStrategy::chooseRandomNeighbour(gen);
            to = from->getAdjCountries()->at(userInput);
        } break;
        case StrategyContext::FORTIFY_ARMY_COUNT: {
            userInput = RandomBotStrategy::sendRandomArmies(gen);
        } break;
        case StrategyContext::ATTACK_NEW_ARMY_COUNT: {
            userInput = RandomBotStrategy::sendRandomArmies(gen);
        } break;
        case StrategyContext::REINFORCE_CARD_COUNT: {
            userInput = RandomBotStrategy::reinforceMaxCards(gen, *exchangingCardType);
        } break;
        case StrategyContext::REINFORCE_ARMY_COUNT: {
            std::uniform_int_distribution<> dis(0, *armiesToPlace);
            userInput = dis(gen);
        }
    }
    std::cout << " " << userInput << std::endl;
    return userInput;
}